

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_equal_string
                  (char *file,wchar_t line,char *v1,char *e1,char *v2,char *e2,void *extra,
                  wchar_t utf8)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  char *in_R8;
  char *in_R9;
  char *unaff_retaddr;
  wchar_t l2;
  wchar_t l1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar2;
  
  assertion_count(in_RDI,in_ESI);
  if ((in_RDX == in_R8) ||
     (((in_RDX != (char *)0x0 && (in_R8 != (char *)0x0)) &&
      (iVar1 = strcmp(in_RDX,in_R8), iVar1 == 0)))) {
    wVar2 = L'\x01';
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"%s != %s",in_RCX,in_R9);
    strlen(in_RCX);
    strlen(in_R9);
    strdump(unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            (wchar_t)((ulong)in_RDI >> 0x20),(wchar_t)in_RDI);
    strdump(unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
            (wchar_t)((ulong)in_RDI >> 0x20),(wchar_t)in_RDI);
    failure_finish((void *)0x1050cc);
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
assertion_equal_string(const char *file, int line,
    const char *v1, const char *e1,
    const char *v2, const char *e2,
    void *extra, int utf8)
{
	int l1, l2;

	assertion_count(file, line);
	if (v1 == v2 || (v1 != NULL && v2 != NULL && strcmp(v1, v2) == 0))
		return (1);
	failure_start(file, line, "%s != %s", e1, e2);
	l1 = (int)strlen(e1);
	l2 = (int)strlen(e2);
	if (l1 < l2)
		l1 = l2;
	strdump(e1, v1, l1, utf8);
	strdump(e2, v2, l1, utf8);
	failure_finish(extra);
	return (0);
}